

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t process_main_locator_extra_block(archive_read *a,rar5 *rar)

{
  wchar_t wVar1;
  ulong local_28;
  uint64_t locator_flags;
  rar5 *rar_local;
  archive_read *a_local;
  
  locator_flags = (uint64_t)rar;
  rar_local = (rar5 *)a;
  wVar1 = read_var(a,&local_28,(uint64_t *)0x0);
  if (wVar1 == L'\0') {
    a_local._4_4_ = L'\x01';
  }
  else if (((local_28 & 1) == 0) ||
          (wVar1 = read_var((archive_read *)rar_local,(uint64_t *)(locator_flags + 0x10),
                            (uint64_t *)0x0), wVar1 != L'\0')) {
    if (((local_28 & 2) == 0) ||
       (wVar1 = read_var((archive_read *)rar_local,(uint64_t *)(locator_flags + 0x18),
                         (uint64_t *)0x0), wVar1 != L'\0')) {
      a_local._4_4_ = L'\0';
    }
    else {
      a_local._4_4_ = L'\x01';
    }
  }
  else {
    a_local._4_4_ = L'\x01';
  }
  return a_local._4_4_;
}

Assistant:

static int process_main_locator_extra_block(struct archive_read* a,
    struct rar5* rar)
{
	uint64_t locator_flags;

	enum LOCATOR_FLAGS {
		QLIST = 0x01, RECOVERY = 0x02,
	};

	if(!read_var(a, &locator_flags, NULL)) {
		return ARCHIVE_EOF;
	}

	if(locator_flags & QLIST) {
		if(!read_var(a, &rar->qlist_offset, NULL)) {
			return ARCHIVE_EOF;
		}

		/* qlist is not used */
	}

	if(locator_flags & RECOVERY) {
		if(!read_var(a, &rar->rr_offset, NULL)) {
			return ARCHIVE_EOF;
		}

		/* rr is not used */
	}

	return ARCHIVE_OK;
}